

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O3

void __thiscall NaPNDelay::post_action(NaPNDelay *this)

{
  if (this->bAwaken == true) {
    NaPetriCnOutput::commit_data(&this->dout);
  }
  NaPetriCnInput::commit_data(&this->in);
  NaPetriCnOutput::commit_data(&this->sync);
  if (this->nActiveSleep != 0) {
    this->nActiveSleep = this->nActiveSleep - 1;
  }
  return;
}

Assistant:

void
NaPNDelay::post_action ()
{
    if(bAwaken){
        // Output data are ready, so deliver them
        dout.commit_data();
    }

    // Welcome for new data
    in.commit_data();

    // Manage linked nodes
    sync.commit_data();

    // Decrement number of active sleeping ticks
    if(nActiveSleep != 0){
      --nActiveSleep;
    }
}